

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffread(FITSfile *fptr,long nbytes,void *buffer,int *status)

{
  int iVar1;
  
  iVar1 = (*driverTable[fptr->driver].read)(fptr->filehandle,buffer,nbytes);
  if (iVar1 == 0x6b) {
    *status = 0x6b;
    iVar1 = 0x6b;
  }
  else if (iVar1 < 1) {
    iVar1 = *status;
  }
  else {
    ffpmsg("Error reading data buffer from file:");
    ffpmsg(fptr->filename);
    *status = 0x6c;
    iVar1 = 0x6c;
  }
  return iVar1;
}

Assistant:

int ffread( FITSfile *fptr,   /* I - FITS file pointer              */
            long nbytes,      /* I - number of bytes to read        */
            void *buffer,     /* O - buffer to read into            */
            int *status)      /* O - error status                   */
/*
  low level routine to read bytes from a file.
*/
{
    int readstatus;

    readstatus = (*driverTable[fptr->driver].read)(fptr->filehandle, 
        buffer, nbytes);

    if (readstatus == END_OF_FILE)
        *status = END_OF_FILE;
    else if (readstatus > 0)
    {
        ffpmsg("Error reading data buffer from file:");
	ffpmsg(fptr->filename);

        *status = READ_ERROR;
    }

    return(*status);
}